

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_sort_tree.hpp
# Opt level: O1

bool __thiscall
duckdb::QuantileCompare<duckdb::MadAccessor<short,_short,_short>_>::operator()
          (QuantileCompare<duckdb::MadAccessor<short,_short,_short>_> *this,INPUT_TYPE *lhs,
          INPUT_TYPE *rhs)

{
  bool bVar1;
  OutOfRangeException *pOVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  string local_48;
  
  sVar5 = *lhs - *this->accessor_l->median;
  if (sVar5 == -0x8000) {
    pOVar2 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Overflow on abs(%d)","");
    OutOfRangeException::OutOfRangeException<short>(pOVar2,&local_48,-0x8000);
    __cxa_throw(pOVar2,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  sVar4 = *rhs - *this->accessor_r->median;
  if (sVar4 != -0x8000) {
    sVar3 = -sVar5;
    if (0 < sVar5) {
      sVar3 = sVar5;
    }
    sVar5 = -sVar4;
    if (0 < sVar4) {
      sVar5 = sVar4;
    }
    bVar1 = sVar3 < sVar5;
    if (this->desc != false) {
      bVar1 = sVar5 < sVar3;
    }
    return bVar1;
  }
  pOVar2 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Overflow on abs(%d)","");
  OutOfRangeException::OutOfRangeException<short>(pOVar2,&local_48,-0x8000);
  __cxa_throw(pOVar2,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

inline bool operator()(const INPUT_TYPE &lhs, const INPUT_TYPE &rhs) const {
		const auto lval = accessor_l(lhs);
		const auto rval = accessor_r(rhs);

		return desc ? (rval < lval) : (lval < rval);
	}